

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::move
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,
          basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *other)

{
  uint *puVar1;
  ulong uVar2;
  uint *__src;
  size_t sVar3;
  
  puVar1 = (other->super_buffer<unsigned_int>).ptr_;
  uVar2 = (other->super_buffer<unsigned_int>).size_;
  sVar3 = (other->super_buffer<unsigned_int>).capacity_;
  __src = other->store_;
  if (puVar1 == __src) {
    (this->super_buffer<unsigned_int>).ptr_ = this->store_;
    (this->super_buffer<unsigned_int>).capacity_ = sVar3;
    if (uVar2 != 0) {
      memmove(this->store_,__src,uVar2 * 4);
    }
  }
  else {
    (this->super_buffer<unsigned_int>).ptr_ = puVar1;
    (this->super_buffer<unsigned_int>).capacity_ = sVar3;
    (other->super_buffer<unsigned_int>).ptr_ = __src;
    (other->super_buffer<unsigned_int>).capacity_ = 0;
    sVar3 = (this->super_buffer<unsigned_int>).capacity_;
  }
  if (sVar3 < uVar2) {
    (**(this->super_buffer<unsigned_int>)._vptr_buffer)(this,uVar2);
  }
  (this->super_buffer<unsigned_int>).size_ = uVar2;
  return;
}

Assistant:

void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              detail::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }